

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O1

void __thiscall fineftp::FtpSession::handleFtpCommandPASS(FtpSession *this,string *param)

{
  int iVar1;
  shared_ptr<fineftp::FtpUser> user;
  string local_48;
  undefined1 local_28 [16];
  
  iVar1 = ::std::__cxx11::string::compare((char *)&this->last_command_);
  if (iVar1 == 0) {
    UserDatabase::getUser
              ((UserDatabase *)local_28,(string *)this->user_database_,
               (string *)&this->username_for_login_);
    if ((element_type *)local_28._0_8_ == (element_type *)0x0) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Failed to log in","");
      sendFtpMessage(this,NOT_LOGGED_IN,&local_48);
    }
    else {
      (this->logged_in_user_).super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_28._0_8_;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->logged_in_user_).
                  super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_28 + 8));
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Login successful","");
      sendFtpMessage(this,USER_LOGGED_IN,&local_48);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._8_8_);
    }
  }
  else {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Please specify username first","");
    sendFtpMessage(this,COMMANDS_BAD_SEQUENCE,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void FtpSession::handleFtpCommandPASS(const std::string& param)
  {
    if (last_command_ != "USER")
    {
      sendFtpMessage(FtpReplyCode::COMMANDS_BAD_SEQUENCE, "Please specify username first");
      return;
    }
    else
    {
      auto user = user_database_.getUser(username_for_login_, param);
      if (user)
      {
        logged_in_user_ = user;
        sendFtpMessage(FtpReplyCode::USER_LOGGED_IN, "Login successful");
        return;
      }
      else
      {
        sendFtpMessage(FtpReplyCode::NOT_LOGGED_IN, "Failed to log in");
        return;
      }
    }
  }